

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueRef *value)

{
  long lVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  string *psVar6;
  ulong uVar7;
  Message *pMVar8;
  undefined4 extraout_var;
  int64 iVar9;
  ulong uVar10;
  LogMessage *pLVar11;
  FieldDescriptor *local_50;
  LogMessage local_48;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_48._0_8_ = FieldDescriptor::TypeOnceInit;
    local_50 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_48,&local_50)
    ;
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
  case 6:
  case 0x10:
    sVar5 = 8;
    break;
  case 2:
  case 7:
  case 0xf:
    sVar5 = 4;
    break;
  case 3:
    uVar10 = MapValueRef::GetInt64Value(value);
    goto LAB_002b20df;
  case 4:
    uVar10 = MapValueRef::GetUInt64Value(value);
    goto LAB_002b20df;
  case 5:
    uVar3 = MapValueRef::GetInt32Value(value);
    goto LAB_002b2178;
  case 8:
    sVar5 = 1;
    break;
  case 9:
  case 0xc:
    psVar6 = MapValueRef::GetStringValue_abi_cxx11_(value);
    uVar7 = psVar6->_M_string_length & 0xffffffff;
    uVar10 = psVar6->_M_string_length;
    goto LAB_002b208a;
  case 10:
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x49f);
    pLVar11 = LogMessage::operator<<(&local_48,"Unsupported");
    LogFinisher::operator=((LogFinisher *)&local_50,pLVar11);
    goto LAB_002b2162;
  case 0xb:
    pMVar8 = MapValueRef::GetMessageValue(value);
    iVar4 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[0xb])(pMVar8);
    uVar7 = CONCAT44(extraout_var,iVar4);
    uVar10 = uVar7;
LAB_002b208a:
    uVar3 = (uint)uVar7 | 1;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = (iVar4 * 9 + 0x49U >> 6) + uVar10;
    break;
  case 0xd:
    uVar3 = MapValueRef::GetUInt32Value(value);
    goto LAB_002b217c;
  case 0xe:
    uVar3 = MapValueRef::GetEnumValue(value);
LAB_002b2178:
    if ((int)uVar3 < 0) {
      return 10;
    }
LAB_002b217c:
    iVar4 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_002b2182;
  case 0x11:
    iVar2 = MapValueRef::GetInt32Value(value);
    uVar3 = iVar2 >> 0x1f ^ iVar2 * 2 | 1;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_002b2182;
  case 0x12:
    iVar9 = MapValueRef::GetInt64Value(value);
    uVar10 = iVar9 >> 0x3f ^ iVar9 * 2;
LAB_002b20df:
    lVar1 = 0x3f;
    if ((uVar10 | 1) != 0) {
      for (; (uVar10 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar4 = (int)lVar1;
LAB_002b2182:
    sVar5 = (size_t)(iVar4 * 9 + 0x49U >> 6);
    break;
  default:
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4bf);
    pLVar11 = LogMessage::operator<<(&local_48,"Cannot get here");
    LogFinisher::operator=((LogFinisher *)&local_50,pLVar11);
LAB_002b2162:
    LogMessage::~LogMessage(&local_48);
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}